

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O0

void baryonyx::debug<std::basic_string_view<char,std::char_traits<char>>,bool>
               (context *ctx,char *fmt,basic_string_view<char,_std::char_traits<char>_> *arg1,
               bool *args)

{
  bool bVar1;
  bool *in_R9;
  bool *args_local;
  basic_string_view<char,_std::char_traits<char>_> *arg1_local;
  char *fmt_local;
  context *ctx_local;
  
  bVar1 = is_loggable(ctx->log_priority,7);
  if (bVar1) {
    log<std::basic_string_view<char,std::char_traits<char>>,bool>
              (_stdout,(FILE *)0x7,(int)fmt,(char *)arg1,
               (basic_string_view<char,_std::char_traits<char>_> *)args,in_R9);
  }
  return;
}

Assistant:

void
debug(const context& ctx,
      const char* fmt,
      const Arg1& arg1,
      const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
#ifdef BARYONYX_ENABLE_DEBUG
    if (!is_loggable(ctx.log_priority, 7))
        return;

    log(stdout, 7, fmt, arg1, args...);
#else
    detail::sink(ctx, fmt, arg1, args...);
#endif
#else
    detail::sink(ctx, fmt, arg1, args...);
#endif
}